

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

void __thiscall libDAI::FactorGraph::backupFactor(FactorGraph *this,size_t I)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *this_00;
  Exception *this_01;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  size_t local_48;
  string local_40;
  
  p_Var1 = &(this->_backupFactors)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->_backupFactors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < I]) {
    if (*(ulong *)(p_Var4 + 1) >= I) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, I < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  local_48 = I;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[10])();
    this_00 = std::
              map<unsigned_long,_libDAI::TFactor<double>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TFactor<double>_>_>_>
              ::operator[](&this->_backupFactors,&local_48);
    TFactor<double>::operator=(this_00,(TFactor<double> *)CONCAT44(extraout_var,iVar2));
    return;
  }
  this_01 = (Exception *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"factorgraph.cpp, line 460","");
  Exception::Exception(this_01,9,&local_40);
  __cxa_throw(this_01,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void FactorGraph::backupFactor( size_t I ) {
        map<size_t,Factor>::iterator it = _backupFactors.find( I );
        if( it != _backupFactors.end() )
            DAI_THROW( MULTIPLE_UNDO );
        _backupFactors[I] = factor(I);
    }